

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arraySlice.c
# Opt level: O3

sysbvm_tuple_t sysbvm_arraySlice_asArray(sysbvm_context_t *context,sysbvm_tuple_t arraySlice)

{
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t sVar3;
  long lVar4;
  sysbvm_tuple_t sVar5;
  sysbvm_tuple_t slotCount;
  
  if ((arraySlice & 0xf) == 0 && arraySlice != 0) {
    uVar1 = *(ulong *)(arraySlice + 0x18);
    if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
      lVar4 = (long)uVar1 >> 4;
    }
    else {
      lVar4 = *(long *)(uVar1 + 0x10);
    }
    uVar1 = *(ulong *)(arraySlice + 0x20);
    if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
      slotCount = (long)uVar1 >> 4;
    }
    else {
      slotCount = *(sysbvm_tuple_t *)(uVar1 + 0x10);
    }
    sVar2 = sysbvm_array_create(context,slotCount);
    if (slotCount != 0) {
      sVar5 = 0;
      do {
        sVar3 = sysbvm_arrayOrByteArray_at(*(sysbvm_tuple_t *)(arraySlice + 0x10),lVar4 + sVar5);
        *(sysbvm_tuple_t *)(sVar2 + 0x10 + sVar5 * 8) = sVar3;
        sVar5 = sVar5 + 1;
      } while (slotCount != sVar5);
    }
  }
  else {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_arraySlice_asArray(sysbvm_context_t *context, sysbvm_tuple_t arraySlice)
{
   if(!sysbvm_tuple_isNonNullPointer(arraySlice)) return SYSBVM_NULL_TUPLE;

    sysbvm_arraySlice_t *arraySliceObject = (sysbvm_arraySlice_t*)arraySlice;
    size_t offset = sysbvm_tuple_size_decode(arraySliceObject->offset);
    size_t size = sysbvm_tuple_size_decode(arraySliceObject->size);

    sysbvm_tuple_t result = sysbvm_array_create(context, size);
    sysbvm_tuple_t *destination = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(result)->pointers;
    for(size_t i = 0; i < size; ++i)
        destination[i] = sysbvm_arrayOrByteArray_at(arraySliceObject->elements, offset + i);
    return result;
}